

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::HasMatchingCachedTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_Xform *mesh_xform)

{
  ON_TextureCoordinates *pOVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int i;
  long lVar6;
  
  lVar5 = 0;
  for (lVar6 = 0; lVar4 = (long)(mesh->m_TC).m_count, lVar6 < lVar4; lVar6 = lVar6 + 1) {
    iVar3 = ON_Mesh::VertexCount(mesh);
    pOVar1 = (mesh->m_TC).m_a;
    if (iVar3 == *(int *)((long)&(pOVar1->m_T).m_count + lVar5)) {
      bVar2 = HasMatchingTextureCoordinates
                        (this,(ON_MappingTag *)((pOVar1->m_tag).m_mapping_id.Data4 + lVar5 + -8),
                         mesh_xform);
      if (bVar2) break;
    }
    lVar5 = lVar5 + 0xb8;
  }
  return lVar6 < lVar4;
}

Assistant:

bool ON_TextureMapping::HasMatchingCachedTextureCoordinates(
  const ON_Mesh& mesh,
  const ON_Xform* mesh_xform
) const
{
  bool rc = false;

  for (int i = 0; i < mesh.m_TC.Count(); i++)
  {
    if (mesh.VertexCount() == mesh.m_TC[i].m_T.Count() && HasMatchingTextureCoordinates(mesh.m_TC[i].m_tag, mesh_xform))
    {
      rc = true;
      break;
    }
  }

  return rc;
}